

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_io_primitive_writeOntoStdout
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  size_t __size;
  bool bVar2;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  bVar2 = (uVar1 & 0xf) != 0;
  if ((bVar2 || uVar1 == 0) || ((*(uint *)(uVar1 + 8) & 0x300) != 0x200)) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/io.c:123: assertion failure: sysbvm_tuple_isBytes(string)"
              );
  }
  if (bVar2 || uVar1 == 0) {
    __size = 0;
  }
  else {
    __size = (size_t)*(uint *)(uVar1 + 0xc);
  }
  fwrite((void *)(uVar1 + 0x10),__size,1,_stdout);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_io_primitive_writeOntoStdout(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t string = arguments[0];
    SYSBVM_ASSERT(sysbvm_tuple_isBytes(string));
    fwrite(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes, sysbvm_tuple_getSizeInBytes(string), 1, stdout);

    return SYSBVM_VOID_TUPLE;
}